

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
fmt::BasicWriter<char>::str_abi_cxx11_(BasicWriter<char> *this)

{
  char *pcVar1;
  size_t sVar2;
  long in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  allocator local_11 [17];
  
  pcVar1 = Buffer<char>::operator[](*(Buffer<char> **)(in_RSI + 8),0);
  sVar2 = Buffer<char>::size(*(Buffer<char> **)(in_RSI + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,sVar2,local_11);
  std::allocator<char>::~allocator((allocator<char> *)local_11);
  return in_RDI;
}

Assistant:

std::basic_string<Char> str() const {
    return std::basic_string<Char>(&buffer_[0], buffer_.size());
  }